

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# some_types.h
# Opt level: O3

void __thiscall
hiberlite::db_atom<std::__cxx11::string>::loadValue<hiberlite::SQLiteSelect,int>
          (db_atom<std::__cxx11::string> *this,SQLiteSelect *res,int *arg)

{
  uchar *puVar1;
  allocator local_31;
  undefined1 *local_30 [2];
  undefined1 local_20 [16];
  
  puVar1 = SQLiteSelect::get_text(res,*arg);
  std::__cxx11::string::string((string *)local_30,(char *)puVar1,&local_31);
  std::__cxx11::string::operator=(*(string **)(this + 8),(string *)local_30);
  if (local_30[0] != local_20) {
    operator_delete(local_30[0]);
  }
  return;
}

Assistant:

void db_atom<std::string>::loadValue(Stmt& res, Arg& arg) {
	val = std::string((const char*)(res.get_text(arg)));
}